

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O2

int secp256k1_fe_impl_is_square_var(secp256k1_fe *x)

{
  int i;
  int iVar1;
  int iVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar15;
  long lVar16;
  int iVar17;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 local_a0;
  secp256k1_modinv64_signed62 local_80;
  secp256k1_fe tmp;
  ulong uVar14;
  
  tmp.n[4] = x->n[4];
  tmp.n[0] = x->n[0];
  tmp.n[1] = x->n[1];
  tmp.n[2] = x->n[2];
  tmp.n[3] = x->n[3];
  secp256k1_fe_impl_normalize_var(&tmp);
  if (((tmp.n[1] == 0 && tmp.n[3] == 0) && (tmp.n[0] == 0 && tmp.n[2] == 0)) && tmp.n[4] == 0) {
    iVar2 = 1;
  }
  else {
    secp256k1_fe_to_signed62(&local_80,&tmp);
    f.v[2] = 0;
    f.v[3] = 0;
    f.v[0] = -0x1000003d1;
    f.v[1] = 0;
    f.v[4] = 0x100;
    lVar16 = -1;
    iVar2 = 5;
    uVar15 = 0;
    for (iVar17 = 0; iVar17 != 0x19; iVar17 = iVar17 + 1) {
      uVar12 = local_80.v[1] << 0x3e | local_80.v[0];
      local_a0.v = 0;
      local_a0.q = 0;
      local_a0.u = 1;
      iVar1 = 0x3e;
      uVar7 = f.v[1] << 0x3e | f.v[0];
      local_a0.r = local_a0.u;
      while( true ) {
        uVar10 = -1L << ((byte)iVar1 & 0x3f) | uVar12;
        lVar6 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        bVar3 = (byte)lVar6;
        uVar12 = uVar12 >> (bVar3 & 0x3f);
        local_a0.u = local_a0.u << (bVar3 & 0x3f);
        local_a0.v = local_a0.v << (bVar3 & 0x3f);
        lVar16 = lVar16 - lVar6;
        uVar15 = ((uint)(uVar7 >> 1) ^ (uint)(uVar7 >> 2)) & (uint)lVar6 ^ uVar15;
        iVar1 = iVar1 - (uint)lVar6;
        if (iVar1 == 0) break;
        iVar8 = (int)uVar7;
        iVar11 = (int)uVar12;
        if (lVar16 < 0) {
          lVar16 = -lVar16;
          uVar15 = uVar15 ^ (uint)((uVar12 & uVar7) >> 1);
          iVar5 = (int)lVar16 + 1;
          cVar4 = (char)iVar5;
          if (iVar1 <= iVar5) {
            cVar4 = (char)iVar1;
          }
          uVar13 = (uint)(0xffffffffffffffff >> (-cVar4 & 0x3fU)) &
                   (iVar11 * iVar11 + 0x3e) * iVar11 * iVar8 & 0x3f;
          uVar10 = uVar12;
          lVar6 = local_a0.v;
          lVar9 = local_a0.u;
          local_a0.u = local_a0.q;
          local_a0.v = local_a0.r;
        }
        else {
          iVar5 = (int)lVar16 + 1;
          cVar4 = (char)iVar5;
          if (iVar1 <= iVar5) {
            cVar4 = (char)iVar1;
          }
          uVar13 = (uint)(0xffffffffffffffff >> (-cVar4 & 0x3fU)) &
                   -(iVar11 * ((iVar8 * 2 + 2U & 8) + iVar8)) & 0xf;
          uVar10 = uVar7;
          lVar6 = local_a0.r;
          uVar7 = uVar12;
          lVar9 = local_a0.q;
        }
        uVar14 = (ulong)uVar13;
        uVar12 = uVar14 * uVar10 + uVar7;
        local_a0.q = local_a0.u * uVar14 + lVar9;
        local_a0.r = uVar14 * local_a0.v + lVar6;
        uVar7 = uVar10;
      }
      secp256k1_modinv64_update_fg_62_var(iVar2,&f,&local_80,&local_a0);
      lVar6 = (long)iVar2;
      if (f.v[0] == 1) {
        uVar7 = 0;
        for (lVar9 = 1; lVar9 < lVar6; lVar9 = lVar9 + 1) {
          uVar7 = uVar7 | f.v[lVar9];
        }
        if (uVar7 == 0) {
          return ~uVar15 & 1;
        }
      }
      iVar1 = iVar2 + -1;
      if ((lVar6 + -2 < 0 || f.v[lVar6 + -1] != 0) || local_80.v[lVar6 + -1] != 0) {
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
    }
    iVar2 = secp256k1_fe_sqrt((secp256k1_fe *)&f,&tmp);
  }
  return iVar2;
}

Assistant:

static int secp256k1_fe_impl_is_square_var(const secp256k1_fe *x) {
    secp256k1_fe tmp;
    secp256k1_modinv64_signed62 s;
    int jac, ret;

    tmp = *x;
    secp256k1_fe_normalize_var(&tmp);
    /* secp256k1_jacobi64_maybe_var cannot deal with input 0. */
    if (secp256k1_fe_is_zero(&tmp)) return 1;
    secp256k1_fe_to_signed62(&s, &tmp);
    jac = secp256k1_jacobi64_maybe_var(&s, &secp256k1_const_modinfo_fe);
    if (jac == 0) {
        /* secp256k1_jacobi64_maybe_var failed to compute the Jacobi symbol. Fall back
         * to computing a square root. This should be extremely rare with random
         * input (except in VERIFY mode, where a lower iteration count is used). */
        secp256k1_fe dummy;
        ret = secp256k1_fe_sqrt(&dummy, &tmp);
    } else {
        ret = jac >= 0;
    }
    return ret;
}